

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QWindowSystemInterface::TouchPoint>::reserve
          (QList<QWindowSystemInterface::TouchPoint> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  Data *pDVar3;
  qsizetype qVar4;
  undefined4 uVar5;
  TouchPoint *data;
  TouchPoint *pTVar6;
  long lVar7;
  TouchPoint *pTVar8;
  TouchPoint *pTVar9;
  TouchPoint *pTVar10;
  TouchPoint *pTVar11;
  long in_FS_OFFSET;
  byte bVar12;
  QArrayData *d;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> local_38;
  QArrayData *local_20;
  long local_18;
  
  bVar12 = 0;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * 0x1111111111111111 + (pDVar2->super_QArrayData).alloc)) {
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_00335a5f;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_00335a5f;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (TouchPoint *)&DAT_aaaaaaaaaaaaaaaa;
  lVar7 = (this->d).size;
  if (asize < lVar7) {
    asize = lVar7;
  }
  local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pTVar6 = (TouchPoint *)QArrayData::allocate(&local_20,0x78,0x10,asize,KeepSize);
  local_38.size = 0;
  lVar7 = (this->d).size;
  if (0 < lVar7) {
    pTVar8 = (this->d).ptr;
    pTVar11 = pTVar8 + lVar7;
    do {
      pTVar6[local_38.size].velocity.v[1] = (pTVar8->velocity).v[1];
      pTVar9 = pTVar8;
      pTVar10 = pTVar6 + local_38.size;
      for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
        uVar5 = *(undefined4 *)&pTVar9->field_0x4;
        pTVar10->id = pTVar9->id;
        *(undefined4 *)&pTVar10->field_0x4 = uVar5;
        pTVar9 = (TouchPoint *)((long)pTVar9 + (ulong)bVar12 * -0x10 + 8);
        pTVar10 = (TouchPoint *)((long)pTVar10 + (ulong)bVar12 * -0x10 + 8);
      }
      pDVar3 = (pTVar8->rawPositions).d.d;
      pTVar6[local_38.size].rawPositions.d.d = pDVar3;
      pTVar6[local_38.size].rawPositions.d.ptr = (pTVar8->rawPositions).d.ptr;
      pTVar6[local_38.size].rawPositions.d.size = (pTVar8->rawPositions).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pTVar8 = pTVar8 + 1;
      local_38.size = local_38.size + 1;
    } while (pTVar8 < pTVar11);
  }
  if (local_20 != (QArrayData *)0x0) {
    *(byte *)&(local_20->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(local_20->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  local_38.d = (this->d).d;
  local_38.ptr = (this->d).ptr;
  (this->d).d = (Data *)local_20;
  (this->d).ptr = pTVar6;
  qVar4 = (this->d).size;
  (this->d).size = local_38.size;
  local_38.size = qVar4;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::~QArrayDataPointer(&local_38);
LAB_00335a5f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}